

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O3

wchar_t main(wchar_t argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  GLFWmonitor *handle;
  GLFWvidmode *pGVar4;
  undefined8 *__ptr;
  GLFWwindow *handle_00;
  ulong uVar5;
  uint width;
  uint height;
  long lVar6;
  undefined8 *pointer;
  char title [128];
  ulong local_d8;
  char local_b8 [136];
  
  setlocale(6,"");
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    puts("Library initialized");
    glfwSetMonitorCallback(monitor_callback);
    glfwSetJoystickCallback(joystick_callback);
    local_d8 = 1;
    handle = (GLFWmonitor *)0x0;
    while( true ) {
      while( true ) {
        iVar2 = getopt(argc,argv,"hfn:");
        if (iVar2 != 0x66) break;
        handle = glfwGetPrimaryMonitor();
      }
      if (iVar2 != 0x6e) break;
      local_d8 = strtoul(optarg,(char **)0x0,10);
    }
    if (iVar2 == -1) {
      if (handle == (GLFWmonitor *)0x0) {
        height = 0x1e0;
        width = 0x280;
      }
      else {
        pGVar4 = glfwGetVideoMode(handle);
        glfwWindowHint(0x2100f,pGVar4->refreshRate);
        glfwWindowHint(0x21001,pGVar4->redBits);
        glfwWindowHint(0x21002,pGVar4->greenBits);
        glfwWindowHint(0x21003,pGVar4->blueBits);
        width = pGVar4->width;
        height = pGVar4->height;
      }
      iVar2 = (int)local_d8;
      __ptr = (undefined8 *)calloc((long)iVar2,0x10);
      if (0 < iVar2) {
        uVar5 = 0;
        pointer = __ptr;
        do {
          *(undefined4 *)((long)pointer + 0xc) = 1;
          uVar5 = uVar5 + 1;
          *(int *)(pointer + 1) = (int)uVar5;
          snprintf(local_b8,0x80,"Event Linter (Window %i)");
          uVar1 = *(uint *)(pointer + 1);
          if (handle == (GLFWmonitor *)0x0) {
            printf("Creating windowed mode window %i (%ix%i)\n",(ulong)uVar1,(ulong)width,
                   (ulong)height);
          }
          else {
            glfwGetMonitorName(handle);
            printf("Creating full screen window %i (%ix%i on %s)\n",(ulong)uVar1,(ulong)width,
                   (ulong)height);
          }
          handle_00 = glfwCreateWindow(width,height,local_b8,handle,(GLFWwindow *)0x0);
          *pointer = handle_00;
          if (handle_00 == (GLFWwindow *)0x0) {
            free(__ptr);
            glfwTerminate();
            goto LAB_00113ece;
          }
          glfwSetWindowUserPointer(handle_00,pointer);
          glfwSetWindowPosCallback((GLFWwindow *)*pointer,window_pos_callback);
          glfwSetWindowSizeCallback((GLFWwindow *)*pointer,window_size_callback);
          glfwSetFramebufferSizeCallback((GLFWwindow *)*pointer,framebuffer_size_callback);
          glfwSetWindowContentScaleCallback((GLFWwindow *)*pointer,window_content_scale_callback);
          glfwSetWindowCloseCallback((GLFWwindow *)*pointer,window_close_callback);
          glfwSetWindowRefreshCallback((GLFWwindow *)*pointer,window_refresh_callback);
          glfwSetWindowFocusCallback((GLFWwindow *)*pointer,window_focus_callback);
          glfwSetWindowIconifyCallback((GLFWwindow *)*pointer,window_iconify_callback);
          glfwSetWindowMaximizeCallback((GLFWwindow *)*pointer,window_maximize_callback);
          glfwSetMouseButtonCallback((GLFWwindow *)*pointer,mouse_button_callback);
          glfwSetCursorPosCallback((GLFWwindow *)*pointer,cursor_position_callback);
          glfwSetCursorEnterCallback((GLFWwindow *)*pointer,cursor_enter_callback);
          glfwSetScrollCallback((GLFWwindow *)*pointer,scroll_callback);
          glfwSetKeyCallback((GLFWwindow *)*pointer,key_callback);
          glfwSetCharCallback((GLFWwindow *)*pointer,char_callback);
          glfwSetDropCallback((GLFWwindow *)*pointer,drop_callback);
          glfwMakeContextCurrent((GLFWwindow *)*pointer);
          gladLoadGLLoader(glfwGetProcAddress);
          glfwSwapInterval(1);
          pointer = pointer + 2;
        } while ((local_d8 & 0xffffffff) != uVar5);
      }
      puts("Main loop starting");
      do {
        if (0 < iVar2) {
          lVar6 = 0;
          do {
            iVar3 = glfwWindowShouldClose(*(GLFWwindow **)((long)__ptr + lVar6));
            if (iVar3 != 0) {
              free(__ptr);
              glfwTerminate();
              goto LAB_00113eb8;
            }
            lVar6 = lVar6 + 0x10;
          } while ((local_d8 & 0xffffffff) * 0x10 != lVar6);
        }
        glfwWaitEvents();
        fflush(_stdout);
      } while( true );
    }
    if (iVar2 == 0x68) {
      usage();
LAB_00113eb8:
      exit(0);
    }
    usage();
  }
LAB_00113ece:
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    Slot* slots;
    GLFWmonitor* monitor = NULL;
    int ch, i, width, height, count = 1;

    setlocale(LC_ALL, "");

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    printf("Library initialized\n");

    glfwSetMonitorCallback(monitor_callback);
    glfwSetJoystickCallback(joystick_callback);

    while ((ch = getopt(argc, argv, "hfn:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;

            case 'n':
                count = (int) strtoul(optarg, NULL, 10);
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);
        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);

        width = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    slots = calloc(count, sizeof(Slot));

    for (i = 0;  i < count;  i++)
    {
        char title[128];

        slots[i].closeable = GLFW_TRUE;
        slots[i].number = i + 1;

        snprintf(title, sizeof(title), "Event Linter (Window %i)", slots[i].number);

        if (monitor)
        {
            printf("Creating full screen window %i (%ix%i on %s)\n",
                   slots[i].number,
                   width, height,
                   glfwGetMonitorName(monitor));
        }
        else
        {
            printf("Creating windowed mode window %i (%ix%i)\n",
                   slots[i].number,
                   width, height);
        }

        slots[i].window = glfwCreateWindow(width, height, title, monitor, NULL);
        if (!slots[i].window)
        {
            free(slots);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetWindowUserPointer(slots[i].window, slots + i);

        glfwSetWindowPosCallback(slots[i].window, window_pos_callback);
        glfwSetWindowSizeCallback(slots[i].window, window_size_callback);
        glfwSetFramebufferSizeCallback(slots[i].window, framebuffer_size_callback);
        glfwSetWindowContentScaleCallback(slots[i].window, window_content_scale_callback);
        glfwSetWindowCloseCallback(slots[i].window, window_close_callback);
        glfwSetWindowRefreshCallback(slots[i].window, window_refresh_callback);
        glfwSetWindowFocusCallback(slots[i].window, window_focus_callback);
        glfwSetWindowIconifyCallback(slots[i].window, window_iconify_callback);
        glfwSetWindowMaximizeCallback(slots[i].window, window_maximize_callback);
        glfwSetMouseButtonCallback(slots[i].window, mouse_button_callback);
        glfwSetCursorPosCallback(slots[i].window, cursor_position_callback);
        glfwSetCursorEnterCallback(slots[i].window, cursor_enter_callback);
        glfwSetScrollCallback(slots[i].window, scroll_callback);
        glfwSetKeyCallback(slots[i].window, key_callback);
        glfwSetCharCallback(slots[i].window, char_callback);
        glfwSetDropCallback(slots[i].window, drop_callback);

        glfwMakeContextCurrent(slots[i].window);
        gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
        glfwSwapInterval(1);
    }

    printf("Main loop starting\n");

    for (;;)
    {
        for (i = 0;  i < count;  i++)
        {
            if (glfwWindowShouldClose(slots[i].window))
                break;
        }

        if (i < count)
            break;

        glfwWaitEvents();

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    free(slots);
    glfwTerminate();
    exit(EXIT_SUCCESS);
}